

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_WriteFileHeaderStr(Super_Man_t *pMan,Vec_Str_t *vStr)

{
  char *pcVar1;
  char *pcVar2;
  char local_408 [8];
  char pBuffer [1000];
  Vec_Str_t *vStr_local;
  Super_Man_t *pMan_local;
  
  sprintf(local_408,"#\n");
  Vec_StrPrintStr(vStr,local_408);
  pcVar2 = pMan->pName;
  pcVar1 = Extra_TimeStamp();
  sprintf(local_408,"# Supergate library derived for \"%s\" on %s.\n",pcVar2,pcVar1);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"#\n");
  Vec_StrPrintStr(vStr,local_408);
  pcVar2 = "-s";
  if (pMan->fSkipInv != 0) {
    pcVar2 = "";
  }
  sprintf(local_408,"# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n",
          (double)pMan->tDelayMax,(double)pMan->tAreaMax,(ulong)(uint)pMan->nVarsMax,
          (ulong)(uint)pMan->nLevels,(ulong)(uint)pMan->nGatesMax,(ulong)(uint)pMan->TimeLimit,
          pcVar2,pMan->pName);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"#\n");
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"# The number of inputs      = %10d.\n",(ulong)(uint)pMan->nVarsMax);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"# The number of levels      = %10d.\n",(ulong)(uint)pMan->nLevels);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"# The maximum delay         = %10.2f.\n",(double)pMan->tDelayMax);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"# The maximum area          = %10.2f.\n",(double)pMan->tAreaMax);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"# The maximum runtime (sec) = %10d.\n",(ulong)(uint)pMan->TimeLimit);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"#\n");
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"# The number of attempts    = %10d.\n",(ulong)(uint)pMan->nTried);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"# The number of supergates  = %10d.\n",(ulong)(uint)pMan->nGates);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"# The number of functions   = %10d.\n",(ulong)(uint)pMan->nUnique);
  Vec_StrPrintStr(vStr,local_408);
  pow(2.0,(double)pMan->nMints);
  sprintf(local_408,"# The total functions       = %.0f (2^%d).\n",(ulong)(uint)pMan->nMints);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"#\n");
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"# Generation time           = %10.2f sec.\n",
          (double)((float)pMan->Time / 1e+06));
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"#\n");
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"%s\n",pMan->pName);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"%d\n",(ulong)(uint)pMan->nVarsMax);
  Vec_StrPrintStr(vStr,local_408);
  sprintf(local_408,"%d\n",(ulong)(uint)pMan->nGates);
  Vec_StrPrintStr(vStr,local_408);
  return;
}

Assistant:

void Super_WriteFileHeaderStr( Super_Man_t * pMan, Vec_Str_t * vStr )
{
    char pBuffer[1000];
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# Supergate library derived for \"%s\" on %s.\n", pMan->pName, Extra_TimeStamp() );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n", 
        pMan->nVarsMax, pMan->nLevels, pMan->nGatesMax, pMan->TimeLimit, pMan->tDelayMax, pMan->tAreaMax, (pMan->fSkipInv? "" : "-s"), pMan->pName );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of inputs      = %10d.\n", pMan->nVarsMax );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of levels      = %10d.\n", pMan->nLevels );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The maximum delay         = %10.2f.\n", pMan->tDelayMax  );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The maximum area          = %10.2f.\n", pMan->tAreaMax );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The maximum runtime (sec) = %10d.\n", pMan->TimeLimit );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of attempts    = %10d.\n", pMan->nTried  );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of supergates  = %10d.\n", pMan->nGates  );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of functions   = %10d.\n", pMan->nUnique );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The total functions       = %.0f (2^%d).\n", pow((double)2,pMan->nMints), pMan->nMints );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# Generation time           = %10.2f sec.\n", (float)(pMan->Time)/(float)(CLOCKS_PER_SEC) );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "%s\n", pMan->pName );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "%d\n", pMan->nVarsMax );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "%d\n", pMan->nGates );
    Vec_StrPrintStr( vStr, pBuffer );
}